

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_common.h
# Opt level: O0

void __thiscall
ktx::OptionsEncodeCommon::process
          (OptionsEncodeCommon *this,Options *param_2,ParseResult *args,Reporter *param_4)

{
  uint uVar1;
  OptionValue *this_00;
  size_t sVar2;
  OptionValue *pOVar3;
  ParseResult *in_RDX;
  OptionsEncodeCommon *in_RDI;
  string *in_stack_ffffffffffffff08;
  ParseResult *in_stack_ffffffffffffff10;
  ParseResult *this_01;
  char *in_stack_ffffffffffffff18;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [16];
  undefined8 in_stack_ffffffffffffff98;
  ParseResult *in_stack_ffffffffffffffa0;
  OptionsEncodeCommon *in_stack_ffffffffffffffa8;
  allocator<char> local_41;
  string local_40 [40];
  ParseResult *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (allocator<char> *)in_stack_ffffffffffffff10);
  this_00 = cxxopts::ParseResult::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  sVar2 = cxxopts::OptionValue::count(this_00);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  if (sVar2 != 0) {
    captureCommonOption(in_RDI,(char *)this_00);
    in_RDI->normalMap = true;
  }
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_79;
  __s = kThreads;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,__s,(allocator<char> *)local_18);
  pOVar3 = cxxopts::ParseResult::operator[](local_18,in_stack_ffffffffffffff08);
  sVar2 = cxxopts::OptionValue::count(pOVar3);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  this_01 = local_18;
  if (sVar2 != 0) {
    uVar1 = captureCodecOption<unsigned_int>
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                       (char *)in_stack_ffffffffffffff98);
    in_RDI->threadCount = uVar1;
    this_01 = local_18;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,__s,(allocator<char> *)this_01);
  pOVar3 = cxxopts::ParseResult::operator[](this_01,(string *)pOVar3);
  sVar2 = cxxopts::OptionValue::count(pOVar3);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if (sVar2 != 0) {
    captureCommonOption(in_RDI,(char *)this_00);
    in_RDI->noSSE = true;
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter&) {
        if (args[kNormalMode].count()) {
            captureCommonOption(kNormalMode);
            normalMap = true;
        }

        if (args[kThreads].count()) {
            threadCount = captureCodecOption<uint32_t>(args, kThreads);
        }

        if (args[kNoSse].count()) {
            captureCommonOption(kNoSse);
            noSSE = true;
        }
    }